

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O3

void __thiscall
density::detail::
LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::LifoArrayImpl(LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *this,size_t i_element_count)

{
  void *new_block;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long *in_FS_OFFSET;
  
  ThreadLifoAllocator<0>::s_allocator::__tls_init();
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_FS_OFFSET[-0x19];
  if (&DAT_0000ffef <
      (undefined1 *)((long)(pbVar1 + i_element_count) - ((ulong)pbVar1 & 0xffffffffffff0000))) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::allocate_slow_path
                       ((lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *)
                        (*in_FS_OFFSET + -200),i_element_count * 0x20);
  }
  else {
    in_FS_OFFSET[-0x19] = (long)(pbVar1 + i_element_count);
  }
  this->m_elements = pbVar1;
  this->m_size = i_element_count;
  return;
}

Assistant:

LifoArrayImpl(size_t i_element_count)
                : m_elements(static_cast<TYPE *>(
                    detail::ThreadLifoAllocator<>::allocate(compute_mem_size(i_element_count)))),
                  m_size(i_element_count)
            {
            }